

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

void __thiscall util::TraceThread(util *this,string_view thread_name,function<void_()> thread_func)

{
  undefined8 uVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Level level;
  char *in_stack_ffffffffffffffb0;
  string local_38;
  long local_18;
  
  pcVar2 = thread_name._M_str;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,thread_name._M_len,this + thread_name._M_len);
  ThreadRename(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  level = (Level)&stack0xffffffffffffffb8;
  logging_function._M_str = "TraceThread";
  logging_function._M_len = 0xb;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/thread.cpp";
  source_file._M_len = 0x58;
  LogPrintf_<std::basic_string_view<char,std::char_traits<char>>>
            (logging_function,source_file,0x14,IPC|QT|LIBEVENT|PROXY|CMPCTBLOCK|ZMQ|HTTP,level,
             in_stack_ffffffffffffffb0,(basic_string_view<char,_std::char_traits<char>_> *)this);
  if (*(long *)(pcVar2 + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      uVar1 = std::__throw_bad_function_call();
      if (local_38._M_dataplus._M_p != &stack0xffffffffffffffb8) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        _Unwind_Resume(uVar1);
      }
    }
  }
  else {
    (**(code **)(pcVar2 + 0x18))(pcVar2);
    logging_function_00._M_str = "TraceThread";
    logging_function_00._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/thread.cpp";
    source_file_00._M_len = 0x58;
    LogPrintf_<std::basic_string_view<char,std::char_traits<char>>>
              (logging_function_00,source_file_00,0x16,
               IPC|QT|LIBEVENT|PROXY|CMPCTBLOCK|ZMQ|BENCH|HTTP|NET,level,in_stack_ffffffffffffffb0,
               (basic_string_view<char,_std::char_traits<char>_> *)this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void util::TraceThread(std::string_view thread_name, std::function<void()> thread_func)
{
    util::ThreadRename(std::string{thread_name});
    try {
        LogPrintf("%s thread start\n", thread_name);
        thread_func();
        LogPrintf("%s thread exit\n", thread_name);
    } catch (const std::exception& e) {
        PrintExceptionContinue(&e, thread_name);
        throw;
    } catch (...) {
        PrintExceptionContinue(nullptr, thread_name);
        throw;
    }
}